

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall optimization::common_expr_del::Env::Env(Env *this,MirFunction *func)

{
  _Rb_tree_color _Var1;
  size_type sVar2;
  pointer ppVar3;
  undefined8 in_RSI;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_RDI;
  iterator end_iter;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *in_stack_ffffffffffffffd8;
  
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = in_RSI;
  sVar2 = std::
          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::size((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  *)0x16957d);
  if (sVar2 == 0) {
    mir::inst::VarId::VarId
              ((VarId *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (uint32_t)((ulong)in_RDI >> 0x20));
    _Var1 = mir::inst::VarId::operator_cast_to_unsigned_int((VarId *)&stack0xffffffffffffffd0);
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _Var1;
  }
  else {
    std::
    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
    ::end(in_RDI);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator--
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_> *)
                        0x1695b1);
    (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = ppVar3->first;
  }
  return;
}

Assistant:

Env(mir::inst::MirFunction& func) : func(func) {
    if (func.variables.size()) {
      auto end_iter = func.variables.end();
      end_iter--;
      varId = end_iter->first;
    } else {
      varId = mir::inst::VarId(65535);
    }
  }